

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O1

bool __thiscall
QCache<QString,_QIcon>::insert
          (QCache<QString,_QIcon> *this,QString *key,QIcon *object,qsizetype cost)

{
  long lVar1;
  Chain *pCVar2;
  Chain *pCVar3;
  Chain *pCVar4;
  Chain *pCVar5;
  long lVar6;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = this->mx;
  if (lVar1 < cost) {
    remove(this,(char *)key);
    if (object != (QIcon *)0x0) {
      QIcon::~QIcon(object);
      operator_delete(object,8);
    }
  }
  else {
    trim(this,lVar1 - cost);
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QHashPrivate::Data<QCache<QString,_QIcon>::Node>::findOrInsert<QString>
              ((InsertionResult *)local_58,&this->d,key);
    pCVar5 = (Chain *)((*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries +
                      (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
                      [(uint)local_58._8_8_ & 0x7f]);
    if (local_58[0x10] == true) {
      pCVar2 = pCVar5[2].next;
      pCVar3 = pCVar5[3].prev;
      pCVar5[2].next = (Chain *)object;
      pCVar5[3].prev = (Chain *)cost;
      if (pCVar2 != (Chain *)0x0) {
        QIcon::~QIcon((QIcon *)pCVar2);
        operator_delete(pCVar2,8);
      }
      relink(this,key);
      lVar6 = cost - (long)pCVar3;
    }
    else {
      pCVar2 = (Chain *)(key->d).d;
      pCVar3 = (Chain *)(key->d).ptr;
      pCVar4 = (Chain *)(key->d).size;
      if (pCVar2 != (Chain *)0x0) {
        LOCK();
        (((QArrayData *)&pCVar2->prev)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&pCVar2->prev)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pCVar5->next = pCVar5;
      pCVar5[1].prev = pCVar2;
      pCVar5[1].next = pCVar3;
      pCVar5[2].prev = pCVar4;
      pCVar5[2].next = (Chain *)object;
      pCVar5[3].prev = (Chain *)cost;
      pCVar5->prev = &this->chain;
      pCVar5->next = (this->chain).next;
      ((this->chain).next)->prev = pCVar5;
      (this->chain).next = pCVar5;
      lVar6 = cost;
    }
    this->total = this->total + lVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return cost <= lVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool insert(const Key &key, T *object, qsizetype cost = 1)
    {
        if (cost > mx) {
            remove(key);
            delete object;
            return false;
        }
        trim(mx - cost);
        auto result = d.findOrInsert(key);
        Node *n = result.it.node();
        if (result.initialized) {
            auto prevCost = n->value.cost;
            result.it.node()->emplace(object, cost);
            cost -= prevCost;
            relink(key);
        } else {
            Node::createInPlace(n, key, object, cost);
            n->prev = &chain;
            n->next = chain.next;
            chain.next->prev = n;
            chain.next = n;
        }
        total += cost;
        return true;
    }